

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O1

int run_test_udp_try_send(void)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv__queue *unaff_RBX;
  uv_loop_t **ppuVar5;
  uv_close_cb p_Var6;
  uv_loop_t ***pppuVar7;
  undefined1 auVar8 [16];
  int64_t eval_b;
  int64_t eval_b_6;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 auStack_80 [16];
  uv_close_cb p_Stack_70;
  uv_close_cb p_Stack_68;
  uv__queue *puStack_60;
  undefined8 uStack_48;
  uv_loop_t **ppuStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  uv_udp_t *puVar4;
  
  puVar4 = (uv_udp_t *)local_38;
  ppuStack_40 = (uv_loop_t **)0x1e25e3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_18);
  local_28._0_8_ = SEXT48(iVar1);
  local_38._0_8_ = (uv_loop_t *)0x0;
  if ((uv_udp_recv_cb)local_28._0_8_ == (uv_udp_recv_cb)0x0) {
    ppuStack_40 = (uv_loop_t **)0x1e2606;
    uVar2 = uv_default_loop();
    ppuStack_40 = (uv_loop_t **)0x1e2615;
    iVar1 = uv_udp_init(uVar2,&server);
    local_28._0_8_ = SEXT48(iVar1);
    local_38._0_8_ = (uv_loop_t *)0x0;
    if ((uv_udp_recv_cb)local_28._0_8_ != (uv_udp_recv_cb)0x0) goto LAB_001e28a7;
    ppuStack_40 = (uv_loop_t **)0x1e2646;
    iVar1 = uv_udp_bind(&server,local_18,0);
    local_28._0_8_ = SEXT48(iVar1);
    local_38._0_8_ = (uv_loop_t *)0x0;
    if ((uv_udp_recv_cb)local_28._0_8_ != (uv_udp_recv_cb)0x0) goto LAB_001e28b4;
    ppuStack_40 = (uv_loop_t **)0x1e267e;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_28._0_8_ = SEXT48(iVar1);
    local_38._0_8_ = (uv_loop_t *)0x0;
    if ((uv_udp_recv_cb)local_28._0_8_ != (uv_udp_recv_cb)0x0) goto LAB_001e28c1;
    ppuStack_40 = (uv_loop_t **)0x1e26b2;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_18);
    local_28._0_8_ = SEXT48(iVar1);
    local_38._0_8_ = (uv_loop_t *)0x0;
    if ((uv_udp_recv_cb)local_28._0_8_ != (uv_udp_recv_cb)0x0) goto LAB_001e28ce;
    ppuStack_40 = (uv_loop_t **)0x1e26d5;
    uVar2 = uv_default_loop();
    ppuStack_40 = (uv_loop_t **)0x1e26e4;
    iVar1 = uv_udp_init(uVar2,&client);
    local_28._0_8_ = SEXT48(iVar1);
    local_38._0_8_ = (uv_loop_t *)0x0;
    if ((uv_udp_recv_cb)local_28._0_8_ != (uv_udp_recv_cb)0x0) goto LAB_001e28db;
    ppuStack_40 = (uv_loop_t **)0x1e2713;
    local_28 = uv_buf_init(run_test_udp_try_send::buffer,0x10000);
    ppuStack_40 = (uv_loop_t **)0x1e2735;
    iVar1 = uv_udp_try_send(&client,local_28,1,local_18);
    local_38._0_8_ = SEXT48(iVar1);
    local_38._8_8_ = (uv_loop_t *)0xffffffffffffffa6;
    if ((uv_loop_t *)local_38._0_8_ != (uv_loop_t *)0xffffffffffffffa6) goto LAB_001e28e8;
    ppuStack_40 = (uv_loop_t **)0x1e2764;
    auVar8 = uv_buf_init("EXIT",4);
    ppuStack_40 = (uv_loop_t **)0x1e2786;
    local_28 = auVar8;
    iVar1 = uv_udp_try_send(&client,local_28,1,local_18);
    local_38._0_8_ = (uv_loop_t *)0x4;
    local_38._8_8_ = SEXT48(iVar1);
    if ((uv_loop_t *)local_38._8_8_ != (uv_loop_t *)0x4) goto LAB_001e28f5;
    ppuStack_40 = (uv_loop_t **)0x1e27a9;
    uVar2 = uv_default_loop();
    ppuStack_40 = (uv_loop_t **)0x1e27b3;
    uv_run(uVar2,0);
    local_38._0_8_ = (uv_loop_t *)0x2;
    local_38._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_38._8_8_ != (uv_loop_t *)0x2) goto LAB_001e2902;
    local_38._0_8_ = (uv_loop_t *)0x1;
    local_38._8_8_ = SEXT48(sv_recv_cb_called);
    if ((uv_loop_t *)local_38._8_8_ != (uv_loop_t *)0x1) goto LAB_001e290f;
    local_38._0_8_ = client.send_queue_size;
    local_38._8_8_ = (uv_loop_t *)0x0;
    if (client.send_queue_size != 0) goto LAB_001e291c;
    local_38._0_8_ = server.send_queue_size;
    local_38._8_8_ = (uv_loop_t *)0x0;
    if (server.send_queue_size != 0) goto LAB_001e2929;
    ppuStack_40 = (uv_loop_t **)0x1e2844;
    unaff_RBX = (uv__queue *)uv_default_loop();
    ppuStack_40 = (uv_loop_t **)0x1e2858;
    uv_walk(unaff_RBX,close_walk_cb,0);
    ppuStack_40 = (uv_loop_t **)0x1e2862;
    uv_run(unaff_RBX,0);
    local_38._0_8_ = (uv_loop_t *)0x0;
    ppuStack_40 = (uv_loop_t **)0x1e286f;
    uVar2 = uv_default_loop();
    ppuStack_40 = (uv_loop_t **)0x1e2877;
    iVar1 = uv_loop_close(uVar2);
    local_38._8_8_ = SEXT48(iVar1);
    if (local_38._0_8_ == local_38._8_8_) {
      ppuStack_40 = (uv_loop_t **)0x1e2892;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    ppuStack_40 = (uv_loop_t **)0x1e28a7;
    run_test_udp_try_send_cold_1();
LAB_001e28a7:
    ppuStack_40 = (uv_loop_t **)0x1e28b4;
    run_test_udp_try_send_cold_2();
LAB_001e28b4:
    ppuStack_40 = (uv_loop_t **)0x1e28c1;
    run_test_udp_try_send_cold_3();
LAB_001e28c1:
    ppuStack_40 = (uv_loop_t **)0x1e28ce;
    run_test_udp_try_send_cold_4();
LAB_001e28ce:
    ppuStack_40 = (uv_loop_t **)0x1e28db;
    run_test_udp_try_send_cold_5();
LAB_001e28db:
    ppuStack_40 = (uv_loop_t **)0x1e28e8;
    run_test_udp_try_send_cold_6();
LAB_001e28e8:
    ppuStack_40 = (uv_loop_t **)0x1e28f5;
    run_test_udp_try_send_cold_7();
LAB_001e28f5:
    ppuStack_40 = (uv_loop_t **)0x1e2902;
    run_test_udp_try_send_cold_8();
LAB_001e2902:
    ppuStack_40 = (uv_loop_t **)0x1e290f;
    run_test_udp_try_send_cold_9();
LAB_001e290f:
    ppuStack_40 = (uv_loop_t **)0x1e291c;
    run_test_udp_try_send_cold_10();
LAB_001e291c:
    ppuStack_40 = (uv_loop_t **)0x1e2929;
    run_test_udp_try_send_cold_11();
LAB_001e2929:
    ppuStack_40 = (uv_loop_t **)0x1e2936;
    run_test_udp_try_send_cold_12();
  }
  ppuVar5 = (uv_loop_t **)(local_38 + 8);
  ppuStack_40 = (uv_loop_t **)alloc_cb;
  run_test_udp_try_send_cold_13();
  bVar3 = puVar4 == &client || puVar4 == &server;
  puVar4 = (uv_udp_t *)CONCAT71(0x103ee,bVar3);
  ppuStack_40 = (uv_loop_t **)(ulong)bVar3;
  uStack_48._0_4_ = 0;
  uStack_48._4_4_ = 0;
  if (ppuStack_40 == (uv_loop_t **)0x0) {
    alloc_cb_cold_2();
  }
  else {
    uStack_48._0_4_ = 0x10000;
    uStack_48._4_4_ = 0;
    ppuStack_40 = ppuVar5;
    if ((long)ppuVar5 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0x103ef00;
    }
  }
  pppuVar7 = &ppuStack_40;
  p_Var6 = (uv_close_cb)&uStack_48;
  alloc_cb_cold_1();
  p_Stack_70 = (uv_close_cb)0x0;
  p_Stack_68 = p_Var6;
  puStack_60 = unaff_RBX;
  if ((long)p_Var6 < 1) {
    auStack_80._0_8_ = (void *)0x1e2a95;
    sv_recv_cb_cold_1();
LAB_001e2a95:
    auStack_80._0_8_ = (void *)0x1e2aa4;
    sv_recv_cb_cold_2();
LAB_001e2aa4:
    auStack_80._0_8_ = (void *)0x1e2aa9;
    sv_recv_cb_cold_4();
  }
  else {
    if (p_Var6 == (uv_close_cb)0x0) {
      if (puVar4 == (uv_udp_t *)0x0) {
        return 0;
      }
      goto LAB_001e2ab8;
    }
    p_Stack_68 = (uv_close_cb)0x4;
    p_Stack_70 = p_Var6;
    if (p_Var6 != (uv_close_cb)0x4) goto LAB_001e2a95;
    if (puVar4 == (uv_udp_t *)0x0) goto LAB_001e2aa4;
    auStack_80._0_8_ = (void *)0x1e2a34;
    iVar1 = memcmp("EXIT",(void *)*extraout_RDX_00,4);
    p_Stack_68 = (uv_close_cb)(long)iVar1;
    p_Stack_70 = (uv_close_cb)0x0;
    if (p_Stack_68 == (uv_close_cb)0x0) {
      auStack_80._0_8_ = (void *)0x1e2a62;
      uv_close(pppuVar7,close_cb);
      auStack_80._0_8_ = (void *)0x1e2a71;
      iVar1 = uv_close(&client,close_cb);
      sv_recv_cb_called = sv_recv_cb_called + 1;
      return iVar1;
    }
  }
  auStack_80._0_8_ = (void *)0x1e2ab8;
  sv_recv_cb_cold_3();
LAB_001e2ab8:
  auStack_80._0_8_ = close_cb;
  sv_recv_cb_cold_5();
  auStack_80._0_8_ = ZEXT18(puVar4 == &client || puVar4 == &server);
  if ((void *)auStack_80._0_8_ == (void *)0x0) {
    puVar4 = (uv_udp_t *)auStack_80;
    close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return iVar1;
    }
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar4,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_try_send) {
  struct sockaddr_in addr;
  static char buffer[64 * 1024];
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init(buffer, sizeof(buffer));
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT_EQ(r, UV_EMSGSIZE);

  buf = uv_buf_init("EXIT", 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT_EQ(4, r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}